

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O2

void secp256k1_scratch_destroy(secp256k1_callback *error_callback,secp256k1_scratch *scratch)

{
  int iVar1;
  
  if (scratch == (secp256k1_scratch *)0x0) {
    return;
  }
  iVar1 = secp256k1_memcmp_var(scratch,"scratch",8);
  if (iVar1 != 0) {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    return;
  }
  if (scratch->alloc_size == 0) {
    free(scratch);
    return;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/scratch_impl.h"
          ,0x20,"test condition failed: scratch->alloc_size == 0");
  abort();
}

Assistant:

static void secp256k1_scratch_destroy(const secp256k1_callback* error_callback, secp256k1_scratch* scratch) {
    if (scratch != NULL) {
        if (secp256k1_memcmp_var(scratch->magic, "scratch", 8) != 0) {
            secp256k1_callback_call(error_callback, "invalid scratch space");
            return;
        }
        VERIFY_CHECK(scratch->alloc_size == 0); /* all checkpoints should be applied */
        memset(scratch->magic, 0, sizeof(scratch->magic));
        free(scratch);
    }
}